

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall
Board::filter_illegal_moves
          (Board *this,
          map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
          *possible_moves,
          map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
          *possible_play_moves,Color color,uint turn)

{
  _Base_ptr *single_play;
  bool bVar1;
  iterator __position;
  iterator __position_00;
  _Base_ptr p_Var2;
  iterator __position_01;
  iterator __position_02;
  _Self __tmp;
  Point source;
  Point destination;
  Point local_7c;
  _Rb_tree<Point,std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>,std::_Select1st<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>>
  *local_78;
  shared_ptr<Piece> original;
  __shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __position_00._M_node = (possible_moves->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = (_Rb_tree<Point,std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>,std::_Select1st<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>>
              *)possible_play_moves;
  while ((_Rb_tree_header *)__position_00._M_node !=
         &(possible_moves->_M_t)._M_impl.super__Rb_tree_header) {
    __position._M_node = __position_00._M_node[2];
    while (__position._M_node != (_Base_ptr)&__position_00._M_node[1]._M_left) {
      source = (Point)__position_00._M_node[1]._M_color;
      destination = (Point)__position._M_node[1]._M_color;
      std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)destination.m_y * 0x10 +
                 *(long *)&(this->m_board).m_data.
                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[destination.m_x].
                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                 ));
      do_move(this,turn,&source,&destination);
      local_7c = find_king(this,color);
      bVar1 = is_threatened(this,&local_7c,color,turn,true);
      std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>);
      undo_move(this,&source,&destination,(shared_ptr<Piece> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if (bVar1) {
        __position = std::
                     _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                     ::erase_abi_cxx11_((_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                                         *)&__position_00._M_node[1]._M_parent,__position._M_node);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if (__position_00._M_node[2]._M_left == (_Base_ptr)0x0) {
      __position_00 =
           std::
           _Rb_tree<Point,std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>,std::_Select1st<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>>
           ::erase_abi_cxx11_((_Rb_tree<Point,std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>,std::_Select1st<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>>
                               *)possible_moves,__position_00);
    }
    else {
      __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
    }
  }
  __position_02._M_node = *(_Base_ptr *)(local_78 + 0x18);
  p_Var2 = (_Base_ptr)(local_78 + 8);
  while (__position_02._M_node != p_Var2) {
    __position_01._M_node = __position_02._M_node[2];
    while (__position_01._M_node != (_Base_ptr)&__position_02._M_node[1]._M_left) {
      single_play = &__position_01._M_node[1]._M_parent;
      get_endangered_pieces
                ((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                  *)&original,this,(play *)single_play);
      do_move(this,(play *)single_play);
      source = find_king(this,color);
      bVar1 = is_threatened(this,&source,color,turn,true);
      undo_move(this,(map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                      *)&original,(play *)single_play);
      if (bVar1) {
        __position_01 =
             std::
             _Rb_tree<Point,std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::_Select1st<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>
             ::erase_abi_cxx11_((_Rb_tree<Point,std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>,std::_Select1st<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>
                                 *)&__position_02._M_node[1]._M_parent,__position_01);
      }
      else {
        __position_01._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
      }
      std::
      _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
      ::~_Rb_tree((_Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                   *)&original);
    }
    if (__position_02._M_node[2]._M_left == (_Base_ptr)0x0) {
      __position_02 =
           std::
           _Rb_tree<Point,std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>,std::_Select1st<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>>
           ::erase_abi_cxx11_(local_78,__position_02);
    }
    else {
      __position_02._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_02._M_node);
    }
  }
  return;
}

Assistant:

void
Board::filter_illegal_moves(map<Point, set<Point>> &possible_moves, map<Point, map<Point, play>> &possible_play_moves,
                            Color color, unsigned int turn) {
    // Filter illegal normal moves.
    for (auto moves = possible_moves.begin(); moves != possible_moves.end();) {
        for (auto move = moves->second.begin(); move != moves->second.end();) {
            auto source = moves->first, destination = *move;
            shared_ptr<Piece> original = m_board[destination];
            do_move(turn, source, destination);
            bool king_threatened = is_threatened(find_king(color), color, turn, true);
            undo_move(source, destination, original);

            if (king_threatened) {
                // Move is illegal.
                move = moves->second.erase(move);
            } else {
                move++;
            }
        }

        if (moves->second.empty()) {
            moves = possible_moves.erase(moves);
        } else {
            moves++;
        }
    }

    // Filter illegal play moves.
    for (auto possible_plays = possible_play_moves.begin(); possible_plays != possible_play_moves.end();) {
        for (auto possible_play = possible_plays->second.begin(); possible_play != possible_plays->second.end();) {
            const auto endangered_pieces = get_endangered_pieces(possible_play->second);
            do_move(possible_play->second);
            const auto king_position = find_king(color);
            bool king_threatened = is_threatened(king_position, color, turn, true);
            undo_move(endangered_pieces, possible_play->second);

            if (king_threatened) {
                // Move is illegal.
                possible_play = possible_plays->second.erase(possible_play);
            } else {
                possible_play++;
            }
        }

        if (possible_plays->second.empty()) {
            possible_plays = possible_play_moves.erase(possible_plays);
        } else {
            possible_plays++;
        }
    }
}